

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
          (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *func)

{
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  Index unaff_retaddr;
  Index in_stack_00000008;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_00000010;
  ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  this_00 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::rows((ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)0x2dbc02);
  ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::cols((ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *)0x2dbc11);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  pMVar1 = MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
                     (this_00,in_stack_ffffffffffffffd8);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& operator=(const ReturnByValue<OtherDerived>& func)
    {
      resize(func.rows(), func.cols());
      return Base::operator=(func);
    }